

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QWindowSystemInterface::TouchPoint>::Inserter::insertOne
          (Inserter *this,qsizetype pos,TouchPoint *t)

{
  Data *pDVar1;
  QPointF *pQVar2;
  qsizetype qVar3;
  TouchPoint *pTVar4;
  undefined4 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  TouchPoint *pTVar9;
  undefined8 *puVar10;
  TouchPoint *pTVar11;
  TouchPoint *pTVar12;
  undefined8 *puVar13;
  byte bVar14;
  
  bVar14 = 0;
  pTVar11 = this->begin;
  lVar7 = this->size;
  pTVar4 = pTVar11 + lVar7;
  this->end = pTVar4;
  this->last = pTVar11 + lVar7 + -1;
  this->where = pTVar11 + pos;
  lVar6 = lVar7 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar6;
  this->sourceCopyAssign = 1;
  if (lVar6 < 1) {
    this->sourceCopyConstruct = 1 - lVar6;
    this->move = 0;
    this->sourceCopyAssign = lVar6;
  }
  if (this->sourceCopyConstruct != 0) {
    pTVar11 = t;
    pTVar9 = pTVar4;
    for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
      uVar5 = *(undefined4 *)&pTVar11->field_0x4;
      pTVar9->id = pTVar11->id;
      *(undefined4 *)&pTVar9->field_0x4 = uVar5;
      pTVar11 = (TouchPoint *)&pTVar11->uniqueId;
      pTVar9 = (TouchPoint *)&pTVar9->uniqueId;
    }
    (pTVar4->velocity).v[1] = (t->velocity).v[1];
    pDVar1 = (t->rawPositions).d.d;
    (t->rawPositions).d.d = (Data *)0x0;
    (pTVar4->rawPositions).d.d = pDVar1;
    pQVar2 = (t->rawPositions).d.ptr;
    (t->rawPositions).d.ptr = (QPointF *)0x0;
    (pTVar4->rawPositions).d.ptr = pQVar2;
    qVar3 = (t->rawPositions).d.size;
    (t->rawPositions).d.size = 0;
    (pTVar4->rawPositions).d.size = qVar3;
    this->size = this->size + 1;
    return;
  }
  pTVar9 = pTVar11 + lVar7 + -1;
  pTVar12 = pTVar4;
  for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar5 = *(undefined4 *)&pTVar9->field_0x4;
    pTVar12->id = pTVar9->id;
    *(undefined4 *)&pTVar12->field_0x4 = uVar5;
    pTVar9 = (TouchPoint *)&pTVar9->uniqueId;
    pTVar12 = (TouchPoint *)&pTVar12->uniqueId;
  }
  (pTVar4->velocity).v[1] = pTVar11[lVar7 + -1].velocity.v[1];
  pDVar1 = pTVar4[-1].rawPositions.d.d;
  pQVar2 = pTVar4[-1].rawPositions.d.ptr;
  pTVar4[-1].rawPositions.d.d = (Data *)0x0;
  pTVar4[-1].rawPositions.d.ptr = (QPointF *)0x0;
  (pTVar4->rawPositions).d.d = pDVar1;
  (pTVar4->rawPositions).d.ptr = pQVar2;
  qVar3 = pTVar4[-1].rawPositions.d.size;
  pTVar4[-1].rawPositions.d.size = 0;
  (pTVar4->rawPositions).d.size = qVar3;
  this->size = this->size + 1;
  if (this->move != 0) {
    lVar6 = 0x60;
    lVar7 = 0;
    do {
      pTVar4 = this->last;
      puVar10 = (undefined8 *)((long)pTVar4 + lVar6 + -0xd8);
      *(undefined4 *)((long)(pTVar4->velocity).v + lVar6 + -0x5c) = *(undefined4 *)(puVar10 + 0xb);
      puVar13 = (undefined8 *)((long)pTVar4 + lVar6 + -0x60);
      for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
        *puVar13 = *puVar10;
        puVar10 = puVar10 + (ulong)bVar14 * -2 + 1;
        puVar13 = puVar13 + (ulong)bVar14 * -2 + 1;
      }
      QArrayDataPointer<QPointF>::operator=
                ((QArrayDataPointer<QPointF> *)((long)(pTVar4->velocity).v + lVar6 + -0x54),
                 (QArrayDataPointer<QPointF> *)((long)pTVar4[-1].velocity.v + lVar6 + -0x54));
      lVar7 = lVar7 + -1;
      lVar6 = lVar6 + -0x78;
    } while (lVar7 != this->move);
  }
  pTVar4 = this->where;
  pTVar11 = t;
  pTVar9 = pTVar4;
  for (lVar7 = 0xb; lVar7 != 0; lVar7 = lVar7 + -1) {
    uVar5 = *(undefined4 *)&pTVar11->field_0x4;
    pTVar9->id = pTVar11->id;
    *(undefined4 *)&pTVar9->field_0x4 = uVar5;
    pTVar11 = (TouchPoint *)((long)pTVar11 + (ulong)bVar14 * -0x10 + 8);
    pTVar9 = (TouchPoint *)((long)pTVar9 + (ulong)bVar14 * -0x10 + 8);
  }
  (pTVar4->velocity).v[1] = (t->velocity).v[1];
  QArrayDataPointer<QPointF>::operator=(&(pTVar4->rawPositions).d,&(t->rawPositions).d);
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }